

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  sqlite3 *psVar1;
  Schema *pSVar2;
  char *pcVar3;
  int iVar4;
  HashElem *pHVar5;
  Vdbe *p;
  Schema **ppSVar6;
  char *zArg1;
  int iVar7;
  
  psVar1 = pParse->db;
  if (pTrigger->pSchema == (Schema *)0x0) {
    iVar7 = -1000000;
  }
  else {
    iVar7 = -1;
    ppSVar6 = &psVar1->aDb->pSchema;
    do {
      iVar7 = iVar7 + 1;
      pSVar2 = *ppSVar6;
      ppSVar6 = ppSVar6 + 4;
    } while (pSVar2 != pTrigger->pSchema);
  }
  pHVar5 = findElementWithHash(&pTrigger->pTabSchema->tblHash,pTrigger->table,(uint *)0x0);
  pcVar3 = psVar1->aDb[iVar7].zDbSName;
  iVar4 = sqlite3AuthCheck(pParse,(uint)(iVar7 != 1) * 2 + 0xe,pTrigger->zName,*pHVar5->data,pcVar3)
  ;
  if (iVar4 == 0) {
    zArg1 = "sqlite_master";
    if (iVar7 == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar4 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,pcVar3);
    if ((iVar4 == 0) && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'trigger\'",
                         psVar1->aDb[iVar7].zDbSName,"sqlite_master",pTrigger->zName);
      sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iVar7,1,
                        (pParse->db->aDb[iVar7].pSchema)->schema_cookie + 1);
      pcVar3 = pTrigger->zName;
      iVar7 = sqlite3VdbeAddOp3(p,0x92,iVar7,0,0);
      sqlite3VdbeChangeP4(p,iVar7,pcVar3,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( pTable );
  assert( pTable->pSchema==pTrigger->pSchema || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  assert( pTable!=0 );
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}